

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkPrintDistribOld(Cba_Ntk_t *p)

{
  int iVar1;
  int *pUserCounts_00;
  int *pUserCounts;
  int pCounts [90];
  Cba_Ntk_t *p_local;
  
  pCounts._352_8_ = p;
  memset(&pUserCounts,0,0x168);
  iVar1 = Cba_ManNtkNum(*(Cba_Man_t **)pCounts._352_8_);
  pUserCounts_00 = (int *)calloc((long)(iVar1 + 1),4);
  Cba_ManCreatePrimMap((char **)(*(long *)pCounts._352_8_ + 0x70));
  Cba_NtkCollectDistrib((Cba_Ntk_t *)pCounts._352_8_,(int *)&pUserCounts,pUserCounts_00);
  Cba_NtkPrintDistribStat((Cba_Ntk_t *)pCounts._352_8_,(int *)&pUserCounts,pUserCounts_00);
  if (pUserCounts_00 != (int *)0x0) {
    free(pUserCounts_00);
  }
  return;
}

Assistant:

void Cba_NtkPrintDistribOld( Cba_Ntk_t * p )
{
    int pCounts[CBA_BOX_LAST] = {0};
    int * pUserCounts = ABC_CALLOC( int, Cba_ManNtkNum(p->pDesign) + 1 );
    Cba_ManCreatePrimMap( p->pDesign->pTypeNames );
    Cba_NtkCollectDistrib( p, pCounts, pUserCounts );
    Cba_NtkPrintDistribStat( p, pCounts, pUserCounts );
    ABC_FREE( pUserCounts );
}